

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O1

void __thiscall
neueda::cdr::findInChildren
          (cdr *this,orderedItemMap *items,cdrKey_t *key,
          vector<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_> *found)

{
  pointer *pppcVar1;
  iterator __position;
  cdrItem *in_RAX;
  _Rb_tree_node_base *p_Var2;
  pointer pcVar3;
  cdrItem *item;
  cdrItem *local_38;
  
  p_Var2 = (items->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var2 != &(items->_M_t)._M_impl.super__Rb_tree_header) {
    local_38 = (cdrItem *)p_Var2[1]._M_parent;
    if (local_38->mKey == *key) {
      if (local_38->mType == CDR_ARRAY) {
        for (pcVar3 = (local_38->mArray).
                      super__Vector_base<neueda::cdr,_std::allocator<neueda::cdr>_>._M_impl.
                      super__Vector_impl_data._M_start; in_RAX = local_38,
            pcVar3 != (pointer)p_Var2[1]._M_parent[3]._M_left; pcVar3 = pcVar3 + 1) {
          findInChildren(this,&pcVar3->mOrdered,key,found);
        }
      }
      else {
        __position._M_current =
             (found->
             super__Vector_base<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (found->
            super__Vector_base<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<neueda::cdrItem_const*,std::allocator<neueda::cdrItem_const*>>::
          _M_realloc_insert<neueda::cdrItem_const*const&>
                    ((vector<neueda::cdrItem_const*,std::allocator<neueda::cdrItem_const*>> *)found,
                     __position,&local_38);
          in_RAX = local_38;
        }
        else {
          *__position._M_current = local_38;
          pppcVar1 = &(found->
                      super__Vector_base<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
          in_RAX = local_38;
        }
      }
    }
    local_38 = in_RAX;
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    in_RAX = local_38;
  }
  return;
}

Assistant:

void
cdr::findInChildren (const orderedItemMap* items,
                     const cdrKey_t& key,
                     vector<const cdrItem*>& found) const
{
    orderedItemMap::const_iterator it0 = items->begin ();
    for (; it0 != items->end (); ++it0)
    {
        if (it0->second->mKey != key)
            continue;
        const cdrItem* item = it0->second;
        if (it0->second->mType == CDR_ARRAY)
        {
            vector<cdr>::const_iterator it = item->mArray.begin ();
            for (; it != it0->second->mArray.end (); ++it)
                findInChildren (&it->mOrdered, key, found);
        }
        else
            found.push_back (item);
    }
}